

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O1

void __thiscall
Analyser_initialisedVariableOfIntegrationInNonFirstComponent_Test::TestBody
          (Analyser_initialisedVariableOfIntegrationInNonFirstComponent_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  undefined8 uVar3;
  char cVar4;
  char *pcVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ScopedTrace gtest_trace_132;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  AnalyserPtr analyser;
  ModelPtr model;
  ParserPtr parser;
  ScopedTrace local_101;
  long *local_100;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  long local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [32];
  Type local_a8;
  undefined4 uStack_a4;
  long local_98;
  shared_ptr *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  shared_ptr *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  string local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  undefined1 local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  long *local_50 [2];
  long local_40 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  libcellml::Parser::create(SUB81(local_60,0));
  local_c8._0_8_ = (pointer)(local_c8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c8,
             "analyser/initialised_variable_of_integration_in_non_first_component.cellml","");
  fileContents((string *)&local_e8);
  libcellml::Parser::parseModel(local_70);
  paVar1 = &local_e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_c8._0_8_ != (pointer)(local_c8 + 0x10)) {
    operator_delete((void *)local_c8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_c8._16_8_)->_M_p + 1));
  }
  local_c8._0_8_ = (pointer)0x0;
  local_100 = (long *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_e8,"size_t(0)","parser->issueCount()",(unsigned_long *)local_c8,
             (unsigned_long *)&local_100);
  if ((char)local_e8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)local_e8._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_e8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x75,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if ((pointer)local_c8._0_8_ != (pointer)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && ((pointer)local_c8._0_8_ != (pointer)0x0)) {
        (**(code **)(((_Alloc_hider *)local_c8._0_8_)->_M_p + 8))();
      }
      local_c8._0_8_ = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,
             "Variable \'time\' in component \'environment\' cannot be both a variable of integration and initialised."
             ,"");
  __l._M_len = 1;
  __l._M_array = &local_e8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_c8,__l,(allocator_type *)&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  libcellml::Analyser::create();
  libcellml::Analyser::analyseModel(local_90);
  testing::ScopedTrace::ScopedTrace
            (&local_101,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
             ,0x84,"Issue occurred here.");
  expectedCellmlElementTypes
            ((ulong)&local_e8,(CellmlElementType)((long)(local_c8._8_8_ - local_c8._0_8_) >> 5));
  expectedLevels((ulong)&local_100,(Level)((long)(local_c8._8_8_ - local_c8._0_8_) >> 5));
  expectedReferenceRules
            ((ulong)&local_a8,(ReferenceRule)((long)(local_c8._8_8_ - local_c8._0_8_) >> 5));
  uVar3 = local_c8._0_8_;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,
             "https://libcellml.org/documentation/guides/latest/runtime_codes/index?issue=ANALYSER_VOI_INITIALISED"
             ,"");
  expectedUrls(&local_30,(long)(local_c8._8_8_ - uVar3) >> 5,local_50);
  local_80 = local_90;
  local_78 = local_88;
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_88 + 8) = *(int *)(local_88 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_88 + 8) = *(int *)(local_88 + 8) + 1;
    }
  }
  expectEqualIssuesCellmlElementTypesLevelsReferenceRulesUrls
            ((vector *)local_c8,(vector *)&local_e8,(vector *)&local_100,(vector *)&local_a8,
             (vector *)&local_30,(shared_ptr *)&local_80);
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  pvVar2 = (void *)CONCAT44(uStack_a4,local_a8);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_98 - (long)pvVar2);
  }
  if (local_100 != (long *)0x0) {
    operator_delete(local_100,local_f0 - (long)local_100);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_e8._M_dataplus._M_p,
                    local_e8.field_2._M_allocated_capacity - (long)local_e8._M_dataplus._M_p);
  }
  local_a8 = INVALID;
  libcellml::Analyser::model();
  local_30.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = libcellml::AnalyserModel::type();
  testing::internal::CmpHelperEQ<libcellml::AnalyserModel::Type,libcellml::AnalyserModel::Type>
            ((internal *)&local_e8,"libcellml::AnalyserModel::Type::INVALID",
             "analyser->model()->type()",&local_a8,(Type *)&local_30);
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
  }
  if ((char)local_e8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_100);
    if ((undefined8 *)local_e8._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_e8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x86,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if (local_100 != (long *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') && (local_100 != (long *)0x0)) {
        (**(code **)(*local_100 + 8))();
      }
      local_100 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::ScopedTrace::~ScopedTrace(&local_101);
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c8);
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

TEST(Analyser, initialisedVariableOfIntegrationInNonFirstComponent)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("analyser/initialised_variable_of_integration_in_non_first_component.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    const std::vector<std::string> expectedIssues = {
        "Variable 'time' in component 'environment' cannot be both a variable of integration and initialised.",
    };

    auto analyser = libcellml::Analyser::create();

    analyser->analyseModel(model);

    EXPECT_EQ_ISSUES_CELLMLELEMENTTYPES_LEVELS_REFERENCERULES_URLS(expectedIssues,
                                                                   expectedCellmlElementTypes(expectedIssues.size(), libcellml::CellmlElementType::VARIABLE),
                                                                   expectedLevels(expectedIssues.size(), libcellml::Issue::Level::ERROR),
                                                                   expectedReferenceRules(expectedIssues.size(), libcellml::Issue::ReferenceRule::ANALYSER_VOI_INITIALISED),
                                                                   expectedUrls(expectedIssues.size(), "https://libcellml.org/documentation/guides/latest/runtime_codes/index?issue=ANALYSER_VOI_INITIALISED"),
                                                                   analyser);

    EXPECT_EQ(libcellml::AnalyserModel::Type::INVALID, analyser->model()->type());
}